

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

int __thiscall
bdConnectManager::checkExistingConnectionAttempt(bdConnectManager *this,bdNodeId *target)

{
  bool bVar1;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_bdNodeId,_bdConnectionRequest>_> local_28;
  iterator it;
  bdNodeId *target_local;
  bdConnectManager *this_local;
  
  it._M_node = (_Base_ptr)target;
  std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdConnectionRequest>_>::_Rb_tree_iterator
            (&local_28);
  local_30 = (_Base_ptr)
             std::
             map<bdNodeId,_bdConnectionRequest,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdConnectionRequest>_>_>
             ::find(&this->mConnectionRequests,it._M_node);
  local_28._M_node = local_30;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<bdNodeId,_bdConnectionRequest,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdConnectionRequest>_>_>
       ::end(&this->mConnectionRequests);
  bVar1 = std::operator!=(&local_28,&local_38);
  this_local._4_4_ = (uint)bVar1;
  return this_local._4_4_;
}

Assistant:

int bdConnectManager::checkExistingConnectionAttempt(bdNodeId *target) {
	std::map<bdNodeId, bdConnectionRequest>::iterator it;
	it = mConnectionRequests.find(*target);
	if (it != mConnectionRequests.end()) {
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::checkExistingConnectAttempt() Found Existing Connection!";
		std::cerr << std::endl;
#endif
		return 1;
	}
	return 0;
}